

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

bool __thiscall ON_Brep::HopAcrossEdge(ON_Brep *this,int *ti,int *tvi)

{
  int iVar1;
  ON_BrepTrim *pOVar2;
  ON_BrepEdge *pOVar3;
  int *piVar4;
  int local_5c;
  int local_4c;
  ON_BrepEdge *edge;
  int new_tvi;
  int new_ti;
  int evi;
  int ei;
  int *tvi_local;
  int *ti_local;
  ON_Brep *this_local;
  
  if (*ti < 0) {
    this_local._7_1_ = false;
  }
  else {
    pOVar2 = ON_ClassArray<ON_BrepTrim>::operator[]((ON_ClassArray<ON_BrepTrim> *)&this->m_T,*ti);
    if (pOVar2->m_ei < 0) {
      this_local._7_1_ = false;
    }
    else {
      pOVar3 = ON_ClassArray<ON_BrepEdge>::operator[]
                         ((ON_ClassArray<ON_BrepEdge> *)&this->m_E,pOVar2->m_ei);
      iVar1 = ON_SimpleArray<int>::Count(&pOVar3->m_ti);
      if (iVar1 < 2) {
        this_local._7_1_ = false;
      }
      else {
        pOVar2 = ON_ClassArray<ON_BrepTrim>::operator[]
                           ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,*ti);
        if ((pOVar2->m_bRev3d & 1U) == 0) {
          local_4c = *tvi;
        }
        else {
          local_4c = 1 - *tvi;
        }
        piVar4 = ON_SimpleArray<int>::operator[](&pOVar3->m_ti,0);
        piVar4 = ON_SimpleArray<int>::operator[](&pOVar3->m_ti,(uint)(*piVar4 == *ti));
        iVar1 = *piVar4;
        if (iVar1 < 0) {
          this_local._7_1_ = false;
        }
        else {
          pOVar2 = ON_ClassArray<ON_BrepTrim>::operator[]
                             ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,iVar1);
          if ((pOVar2->m_bRev3d & 1U) == 0) {
            local_5c = local_4c;
          }
          else {
            local_5c = 1 - local_4c;
          }
          *ti = iVar1;
          *tvi = local_5c;
          this_local._7_1_ = true;
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Brep::HopAcrossEdge( int& ti, int& tvi ) const
{
  // Tf ti is a trim associated with an interior manifold edge,
  // then ti is set to twin.
  int ei, evi, new_ti, new_tvi;
  if ( ti < 0 )
    return false;
  ei = m_T[ti].m_ei;
  if ( ei < 0 )
    return false;
  const ON_BrepEdge& edge = m_E[ei];
  if ( edge.m_ti.Count() < 2 )
    return false;
  evi = (m_T[ti].m_bRev3d) ? 1-tvi : tvi;
  new_ti = edge.m_ti[(edge.m_ti[0] == ti)?1:0];
  if ( new_ti < 0 )
    return false;
  new_tvi = (m_T[new_ti].m_bRev3d) ? 1-evi : evi;
  ti = new_ti;
  tvi = new_tvi;
  return true;
}